

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_MDRP(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  ushort uVar2;
  FT_Int32 FVar3;
  FT_Int32 FVar4;
  FT_Vector *pFVar5;
  FT_Vector *pFVar6;
  FT_F26Dot6 FVar7;
  FT_F26Dot6 minimum_distance;
  FT_Vector vec;
  FT_Vector *vec2_1;
  FT_Vector *vec1_1;
  FT_Vector *vec2;
  FT_Vector *vec1;
  FT_F26Dot6 distance;
  FT_F26Dot6 org_dist;
  FT_UShort point;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = *args;
  uVar2 = (ushort)uVar1;
  if ((uVar2 < (exc->zp1).n_points) && ((exc->GS).rp0 < (exc->zp0).n_points)) {
    if (((exc->GS).gep0 == 0) || ((exc->GS).gep1 == 0)) {
      pFVar5 = (exc->zp1).org + (uVar1 & 0xffff);
      pFVar6 = (exc->zp0).org + (exc->GS).rp0;
      distance = (*exc->func_dualproj)(exc,pFVar5->x - pFVar6->x,pFVar5->y - pFVar6->y);
    }
    else {
      pFVar5 = (exc->zp1).orus + (uVar1 & 0xffff);
      pFVar6 = (exc->zp0).orus + (exc->GS).rp0;
      if ((exc->metrics).x_scale == (exc->metrics).y_scale) {
        FVar7 = (*exc->func_dualproj)(exc,pFVar5->x - pFVar6->x,pFVar5->y - pFVar6->y);
        FVar3 = FT_MulFix_x86_64((FT_Int32)FVar7,(FT_Int32)(exc->metrics).x_scale);
        distance = (FT_F26Dot6)FVar3;
      }
      else {
        FVar3 = FT_MulFix_x86_64((int)pFVar5->x - (int)pFVar6->x,(FT_Int32)(exc->metrics).x_scale);
        FVar4 = FT_MulFix_x86_64((int)pFVar5->y - (int)pFVar6->y,(FT_Int32)(exc->metrics).y_scale);
        distance = (*exc->func_dualproj)(exc,(long)FVar3,(long)FVar4);
      }
    }
    if (((0 < (exc->GS).single_width_cutin) &&
        (distance < (exc->GS).single_width_value + (exc->GS).single_width_cutin)) &&
       ((exc->GS).single_width_value - (exc->GS).single_width_cutin < distance)) {
      if (distance < 0) {
        distance = -(exc->GS).single_width_value;
      }
      else {
        distance = (exc->GS).single_width_value;
      }
    }
    if ((exc->opcode & 4) == 0) {
      vec1 = (FT_Vector *)Round_None(exc,distance,exc->opcode & 3);
    }
    else {
      vec1 = (FT_Vector *)(*exc->func_round)(exc,distance,(uint)exc->opcode & 3);
    }
    if ((exc->opcode & 8) != 0) {
      pFVar5 = (FT_Vector *)(exc->GS).minimum_distance;
      if (distance < 0) {
        if (-(long)pFVar5 < (long)vec1) {
          vec1 = (FT_Vector *)-(long)pFVar5;
        }
      }
      else if ((long)vec1 < (long)pFVar5) {
        vec1 = pFVar5;
      }
    }
    FVar7 = (*exc->func_project)
                      (exc,(exc->zp1).cur[(int)(uint)uVar2].x -
                           (exc->zp0).cur[(int)(uint)(exc->GS).rp0].x,
                       (exc->zp1).cur[(int)(uint)uVar2].y -
                       (exc->zp0).cur[(int)(uint)(exc->GS).rp0].y);
    (*exc->func_move)(exc,&exc->zp1,uVar2,(long)vec1 - FVar7);
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  (exc->GS).rp1 = (exc->GS).rp0;
  (exc->GS).rp2 = uVar2;
  if ((exc->opcode & 0x10) != 0) {
    (exc->GS).rp0 = uVar2;
  }
  return;
}

Assistant:

static void
  Ins_MDRP( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_UShort   point = 0;
    FT_F26Dot6  org_dist, distance;


    point = (FT_UShort)args[0];

    if ( BOUNDS( point,       exc->zp1.n_points ) ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    /* XXX: Is there some undocumented feature while in the */
    /*      twilight zone?                                  */

    /* XXX: UNDOCUMENTED: twilight zone special case */

    if ( exc->GS.gep0 == 0 || exc->GS.gep1 == 0 )
    {
      FT_Vector*  vec1 = &exc->zp1.org[point];
      FT_Vector*  vec2 = &exc->zp0.org[exc->GS.rp0];


      org_dist = DUALPROJ( vec1, vec2 );
    }
    else
    {
      FT_Vector*  vec1 = &exc->zp1.orus[point];
      FT_Vector*  vec2 = &exc->zp0.orus[exc->GS.rp0];


      if ( exc->metrics.x_scale == exc->metrics.y_scale )
      {
        /* this should be faster */
        org_dist = DUALPROJ( vec1, vec2 );
        org_dist = FT_MulFix( org_dist, exc->metrics.x_scale );
      }
      else
      {
        FT_Vector  vec;


        vec.x = FT_MulFix( SUB_LONG( vec1->x, vec2->x ),
                           exc->metrics.x_scale );
        vec.y = FT_MulFix( SUB_LONG( vec1->y, vec2->y ),
                           exc->metrics.y_scale );

        org_dist = FAST_DUALPROJ( &vec );
      }
    }

    /* single width cut-in test */

    /* |org_dist - single_width_value| < single_width_cutin */
    if ( exc->GS.single_width_cutin > 0          &&
         org_dist < exc->GS.single_width_value +
                      exc->GS.single_width_cutin &&
         org_dist > exc->GS.single_width_value -
                      exc->GS.single_width_cutin )
    {
      if ( org_dist >= 0 )
        org_dist = exc->GS.single_width_value;
      else
        org_dist = -exc->GS.single_width_value;
    }

    /* round flag */

    if ( ( exc->opcode & 4 ) != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY &&
           exc->ignore_x_mode          &&
           exc->GS.freeVector.x != 0   )
        distance = Round_None( exc, org_dist, exc->opcode & 3 );
      else
#endif
        distance = exc->func_round( exc, org_dist, exc->opcode & 3 );
    }
    else
      distance = Round_None( exc, org_dist, exc->opcode & 3 );

    /* minimum distance flag */

    if ( ( exc->opcode & 8 ) != 0 )
    {
      FT_F26Dot6  minimum_distance = exc->GS.minimum_distance;


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY                        &&
           exc->ignore_x_mode                                 &&
           exc->GS.freeVector.x != 0                          &&
           !( exc->sph_tweak_flags & SPH_TWEAK_NORMAL_ROUND ) )
        minimum_distance = 0;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      if ( org_dist >= 0 )
      {
        if ( distance < minimum_distance )
          distance = minimum_distance;
      }
      else
      {
        if ( distance > NEG_LONG( minimum_distance ) )
          distance = NEG_LONG( minimum_distance );
      }
    }

    /* now move the point */

    org_dist = PROJECT( exc->zp1.cur + point, exc->zp0.cur + exc->GS.rp0 );

    exc->func_move( exc, &exc->zp1, point, SUB_LONG( distance, org_dist ) );

  Fail:
    exc->GS.rp1 = exc->GS.rp0;
    exc->GS.rp2 = point;

    if ( ( exc->opcode & 16 ) != 0 )
      exc->GS.rp0 = point;
  }